

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

void __thiscall
BailOutRecord::AdjustOffsetsForDiagMode
          (BailOutRecord *this,JavascriptCallStackLayout *layout,ScriptFunction *function)

{
  uint uVar1;
  int iVar2;
  Utf8SourceInfo *pUVar3;
  GlobalBailOutRecordDataTable *pGVar4;
  GlobalBailOutRecordDataRow *pGVar5;
  code *pcVar6;
  bool bVar7;
  uint32 uVar8;
  FunctionBody *this_00;
  undefined4 *puVar9;
  FunctionEntryPointInfo *pFVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  int local_34;
  
  this_00 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  if (this_00 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x324,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar7) goto LAB_003fdd97;
    *puVar9 = 0;
  }
  pUVar3 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  if ((((pUVar3->debugModeSource).ptr == (uchar *)0x0) && ((pUVar3->field_0xa8 & 0x20) == 0)) ||
     ((pUVar3->field_0xa8 & 0x40) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x326,"(functionBody->IsInDebugMode())","functionBody->IsInDebugMode()");
    if (!bVar7) goto LAB_003fdd97;
    *puVar9 = 0;
  }
  pFVar10 = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(this_00);
  if (pFVar10 == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x329,"(entryPointInfo != nullptr)","entryPointInfo != nullptr");
    if (!bVar7) goto LAB_003fdd97;
    *puVar9 = 0;
  }
  if (pFVar10->localVarChangedOffset != -1) {
    uVar8 = Js::FunctionBody::GetNonTempLocalVarCount(this_00);
    if (uVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x32e,"(functionBody->GetNonTempLocalVarCount() != 0)",
                         "functionBody->GetNonTempLocalVarCount() != 0");
      if (!bVar7) {
LAB_003fdd97:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar9 = 0;
    }
    pcVar11 = Js::JavascriptCallStackLayout::GetValueChangeOffset
                        (layout,pFVar10->localVarChangedOffset);
    if ((*pcVar11 == '\x01') && (pGVar4 = this->globalBailOutRecordTable, pGVar4->length != 0)) {
      uVar1 = this->m_bailOutRecordId;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar13 = 0;
      uVar12 = 0;
      do {
        pGVar5 = pGVar4->globalBailOutRecordDataRows;
        if (uVar1 <= *(uint *)((long)&pGVar5->end + lVar13)) {
          if (uVar1 < *(uint *)((long)&pGVar5->start + lVar13)) {
            return;
          }
          iVar2 = *(int *)((long)&pGVar5->offset + lVar13);
          if (iVar2 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x339,"(offset != 0)","offset != 0");
            if (!bVar7) goto LAB_003fdd97;
            *puVar9 = 0;
          }
          bVar7 = Js::FunctionBody::GetSlotOffset
                            (this_00,*(uint *)(&pGVar5->field_0xc + lVar13) & 0x3fffffff,&local_34,
                             false);
          if (bVar7) {
            local_34 = local_34 + pFVar10->localVarSlotsOffset;
            if ((iVar2 < 1) && (iVar2 != local_34)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                 ,0x33f,"(offset > 0 || offset == slotOffset)",
                                 "offset > 0 || offset == slotOffset");
              if (!bVar7) goto LAB_003fdd97;
              *puVar9 = 0;
            }
            *(int *)((long)&pGVar5->offset + lVar13) = local_34;
          }
        }
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar12 < pGVar4->length);
    }
  }
  return;
}

Assistant:

void
BailOutRecord::AdjustOffsetsForDiagMode(Js::JavascriptCallStackLayout * layout, Js::ScriptFunction * function) const
{
    // In this function we are going to do
    // 1. Check if the value got changed (by checking at the particular location at the stack)
    // 2. In that case update the offset to point to the stack offset

    Js::FunctionBody *functionBody =  function->GetFunctionBody();
    Assert(functionBody != nullptr);

    Assert(functionBody->IsInDebugMode());

    Js::FunctionEntryPointInfo *entryPointInfo = functionBody->GetDefaultFunctionEntryPointInfo();
    Assert(entryPointInfo != nullptr);

    // Note: the offset may be not initialized/InvalidOffset when there are no non-temp local vars.
    if (entryPointInfo->localVarChangedOffset != Js::Constants::InvalidOffset)
    {
        Assert(functionBody->GetNonTempLocalVarCount() != 0);

        char * valueChangeOffset = layout->GetValueChangeOffset(entryPointInfo->localVarChangedOffset);
        if (*valueChangeOffset == Js::FunctionBody::LocalsChangeDirtyValue)
        {
            // The value got changed due to debugger, lets read values from the stack position
            // Get the corresponding offset on the stack related to the frame.

            globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow *row) {
                int32 offset = row->offset;
                // offset is zero, is it possible that a locals is not living in the debug mode?
                Assert(offset != 0);
                int32 slotOffset;
                if (functionBody->GetSlotOffset(row->regSlot, &slotOffset))
                {
                    slotOffset = entryPointInfo->localVarSlotsOffset + slotOffset;
                    // If it was taken from the stack location, we should have arrived to the same stack location.
                    Assert(offset > 0 || offset == slotOffset);
                    row->offset = slotOffset;
                }
            });
        }
    }
}